

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# follyqueue.cpp
# Opt level: O3

int read_proc(void)

{
  long lVar1;
  
  if (result <= g_maxCount) {
    do {
      if (q.readIndex_.super___atomic_base<int>._M_i == q.writeIndex_.super___atomic_base<int>._M_i)
      {
        usleep(1);
      }
      else if (q.readIndex_.super___atomic_base<int>._M_i ==
               q.writeIndex_.super___atomic_base<int>._M_i) {
        result = 0;
      }
      else {
        lVar1 = (long)(int)q.readIndex_.super___atomic_base<int>._M_i;
        q.readIndex_.super___atomic_base<int>._M_i =
             (__atomic_base<int>)((int)q.readIndex_.super___atomic_base<int>._M_i + 1);
        if (q.readIndex_.super___atomic_base<int>._M_i == (__atomic_base<int>)q.size_) {
          q.readIndex_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
        }
        result = q.records_[lVar1];
      }
    } while (result <= g_maxCount);
  }
  g_running = false;
  return 0;
}

Assistant:

int read_proc()
{
	int number = 0 ; 
	// You can also peek at the front item of the queue (consumer only)
	while(result <= g_maxCount)
	{
		//int* front = q.peek();
		if (!q.isEmpty())
		{
			result = q.try_dequeue(number); 
			if (result)
			{
				Log("result is "<< result << " num is " << number ); 
				result = number; 
			}
			else 
			{
				Log("dequeue failed"); 

			}
		}
		else 
		{
			usleep(1); 
		}
	}

	g_running = false; 
	Log(" read finished " ); ; 
	return 0; 
}